

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::SetSecurePendingDataset
          (CommissionerImpl *this,ErrorHandler *aHandler,uint32_t aMaxRetrievalTimer,
          PendingOperationalDataset *aDataset)

{
  pointer *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  ByteArray *this_01;
  Error *pEVar4;
  uint64_t aInteger;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  Error local_910;
  ErrorCode local_8e8;
  anon_class_1_0_00000001 local_8e2;
  v10 local_8e1;
  v10 *local_8e0;
  size_t local_8d8;
  string local_8d0;
  allocator local_8a9;
  string local_8a8;
  ResponseHandler local_888;
  ErrorCode local_864;
  Error local_860;
  ErrorCode local_834;
  Error local_830;
  ErrorCode local_804;
  Tlv local_800;
  Error local_7e0;
  uchar *local_7b8;
  char *local_7b0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7a8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_7a0;
  const_iterator local_798;
  string local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  Address local_710;
  ErrorCode local_6f4;
  Tlv local_6f0;
  Error local_6d0;
  ErrorCode local_6a8;
  allocator local_6a1;
  string local_6a0;
  Error local_680;
  ErrorHandler local_658;
  anon_class_1_0_00000001 local_632;
  v10 local_631;
  v10 *local_630;
  size_t local_628;
  string local_620;
  Error local_600;
  anon_class_1_0_00000001 local_5d2;
  v10 local_5d1;
  v10 *local_5d0;
  size_t local_5c8;
  string local_5c0;
  Error local_5a0;
  anon_class_1_0_00000001 local_572;
  v10 local_571;
  v10 *local_570;
  size_t local_568;
  string local_560;
  Error local_540;
  undefined1 local_518 [8];
  anon_class_272_4_c83933d0 onMeshLocalPrefixResponse;
  anon_class_32_1_d0c21527 onResponse;
  undefined1 local_3d8 [8];
  Request request;
  string uri;
  ByteArray secureDissemination;
  Address pbbrAddr;
  Error error;
  PendingOperationalDataset *aDataset_local;
  uint32_t aMaxRetrievalTimer_local;
  ErrorHandler *aHandler_local;
  CommissionerImpl *this_local;
  undefined1 local_2a0 [16];
  v10 *local_290;
  ulong local_288;
  v10 *local_280;
  size_t sStack_278;
  string *local_270;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_268 [3];
  undefined1 local_250 [16];
  v10 *local_240;
  ulong local_238;
  v10 *local_230;
  size_t sStack_228;
  string *local_220;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_218 [3];
  undefined1 local_200 [16];
  v10 *local_1f0;
  ulong local_1e8;
  v10 *local_1e0;
  size_t sStack_1d8;
  string *local_1d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_1c8 [2];
  undefined1 local_1b8 [16];
  v10 *local_1a8;
  ulong local_1a0;
  v10 *local_198;
  size_t sStack_190;
  string *local_188;
  v10 *local_180;
  v10 **local_178;
  v10 *local_170;
  v10 **local_168;
  v10 *local_160;
  v10 **local_158;
  v10 *local_150;
  v10 **local_148;
  v10 **local_140;
  v10 *local_138;
  size_t sStack_130;
  v10 **local_120;
  v10 *local_118;
  size_t sStack_110;
  v10 **local_100;
  v10 *local_f8;
  size_t sStack_f0;
  v10 **local_e0;
  v10 *local_d8;
  size_t sStack_d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_c8;
  undefined1 *local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_a0;
  undefined1 *local_98;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_90;
  undefined8 local_88;
  undefined1 *local_80;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_78;
  undefined1 *local_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  CommissionerImpl **local_50;
  undefined1 *local_48;
  CommissionerImpl **local_40;
  undefined8 local_38;
  undefined1 *local_30;
  CommissionerImpl **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_20;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_10;
  
  Error::Error((Error *)&pbbrAddr.mBytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  Address::Address((Address *)
                   &secureDissemination.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&uri.field_2 + 8));
  std::__cxx11::string::string((string *)&request.mEndpoint);
  coap::Message::Message((Message *)local_3d8,kConfirmable,kPost);
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)
             &onMeshLocalPrefixResponse.aDataset.mPendingTimestamp,aHandler);
  local_518 = (undefined1  [8])this;
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&onMeshLocalPrefixResponse,aHandler);
  onMeshLocalPrefixResponse.aHandler._M_invoker._0_4_ = aMaxRetrievalTimer;
  PendingOperationalDataset::PendingOperationalDataset
            ((PendingOperationalDataset *)&onMeshLocalPrefixResponse.aMaxRetrievalTimer,aDataset);
  if (((aDataset->super_ActiveOperationalDataset).mPresentFlags & 0x20) == 0) {
    SetSecurePendingDataset::anon_class_1_0_00000001::operator()(&local_572);
    local_178 = &local_570;
    local_180 = &local_571;
    bVar5 = ::fmt::v10::operator()(local_180);
    local_568 = bVar5.size_;
    local_570 = (v10 *)bVar5.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_188 = &local_560;
    local_198 = local_570;
    sStack_190 = local_568;
    local_140 = &local_198;
    local_1a8 = local_570;
    local_1a0 = local_568;
    local_138 = local_1a8;
    sStack_130 = local_1a0;
    local_1c8[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_c0 = local_1b8;
    local_c8 = local_1c8;
    local_b0 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_c8;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_1a0;
    local_b8 = local_c8;
    local_a8 = local_c0;
    local_10 = local_c8;
    ::fmt::v10::vformat_abi_cxx11_(&local_560,local_1a8,fmt,args);
    Error::Error(&local_540,kInvalidArgs,&local_560);
    Error::operator=((Error *)&pbbrAddr.mBytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,&local_540);
    Error::~Error(&local_540);
    std::__cxx11::string::~string((string *)&local_560);
  }
  else {
    uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[9])();
    if ((uVar2 & 1) == 0) {
      SetSecurePendingDataset::anon_class_1_0_00000001::operator()(&local_5d2);
      local_168 = &local_5d0;
      local_170 = &local_5d1;
      bVar5 = ::fmt::v10::operator()(local_170);
      local_5c8 = bVar5.size_;
      local_5d0 = (v10 *)bVar5.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_1d0 = &local_5c0;
      local_1e0 = local_5d0;
      sStack_1d8 = local_5c8;
      local_120 = &local_1e0;
      local_1f0 = local_5d0;
      local_1e8 = local_5c8;
      local_118 = local_1f0;
      sStack_110 = local_1e8;
      local_218[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_98 = local_200;
      local_a0 = local_218;
      local_88 = 0;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_a0;
      fmt_00.size_ = 0;
      fmt_00.data_ = (char *)local_1e8;
      local_90 = local_a0;
      local_80 = local_98;
      local_18 = local_a0;
      ::fmt::v10::vformat_abi_cxx11_(&local_5c0,local_1f0,fmt_00,args_00);
      Error::Error(&local_5a0,kInvalidState,&local_5c0);
      Error::operator=((Error *)&pbbrAddr.mBytes.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,&local_5a0);
      Error::~Error(&local_5a0);
      std::__cxx11::string::~string((string *)&local_5c0);
    }
    else {
      uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
      if ((uVar2 & 1) == 0) {
        SetSecurePendingDataset::anon_class_1_0_00000001::operator()(&local_632);
        local_158 = &local_630;
        local_160 = &local_631;
        bVar5 = ::fmt::v10::operator()(local_160);
        local_628 = bVar5.size_;
        local_630 = (v10 *)bVar5.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_220 = &local_620;
        local_230 = local_630;
        sStack_228 = local_628;
        local_100 = &local_230;
        local_240 = local_630;
        local_238 = local_628;
        local_f8 = local_240;
        sStack_f0 = local_238;
        local_268[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
        local_70 = local_250;
        local_78 = local_268;
        local_60 = 0;
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)local_78;
        fmt_01.size_ = 0;
        fmt_01.data_ = (char *)local_238;
        local_68 = local_78;
        local_58 = local_70;
        local_20 = local_78;
        ::fmt::v10::vformat_abi_cxx11_(&local_620,local_240,fmt_01,args_01);
        Error::Error(&local_600,kInvalidState,&local_620);
        Error::operator=((Error *)&pbbrAddr.mBytes.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_600);
        Error::~Error(&local_600);
        std::__cxx11::string::~string((string *)&local_620);
      }
      else {
        this_01 = ProxyClient::GetMeshLocalPrefix(&this->mProxyClient);
        bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(this_01);
        if (bVar1) {
          std::function<void(ot::commissioner::Error)>::
          function<ot::commissioner::CommissionerImpl::SetSecurePendingDataset(std::function<void(ot::commissioner::Error)>,unsigned_int,ot::commissioner::PendingOperationalDataset_const&)::__0&,void>
                    ((function<void(ot::commissioner::Error)> *)&local_658,
                     (anon_class_272_4_c83933d0 *)local_518);
          ProxyClient::FetchMeshLocalPrefix(&this->mProxyClient,&local_658);
          std::function<void_(ot::commissioner::Error)>::~function(&local_658);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_6a0,"/c/sp",&local_6a1);
          coap::Message::SetUriPath(&local_680,(Message *)local_3d8,&local_6a0);
          pEVar4 = Error::operator=((Error *)&pbbrAddr.mBytes.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    &local_680);
          local_6a8 = kNone;
          bVar1 = commissioner::operator!=(pEVar4,&local_6a8);
          Error::~Error(&local_680);
          std::__cxx11::string::~string((string *)&local_6a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
          if (!bVar1) {
            iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[7])();
            tlv::Tlv::Tlv(&local_6f0,kCommissionerSessionId,(uint16_t)iVar3,kMeshCoP);
            AppendTlv(&local_6d0,(Message *)local_3d8,&local_6f0);
            pEVar4 = Error::operator=((Error *)&pbbrAddr.mBytes.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      &local_6d0);
            local_6f4 = kNone;
            bVar1 = commissioner::operator!=(pEVar4,&local_6f4);
            Error::~Error(&local_6d0);
            tlv::Tlv::~Tlv(&local_6f0);
            if (!bVar1) {
              ProxyClient::GetAnycastLocator(&local_710,&this->mProxyClient,0xfc38);
              this_00 = &secureDissemination.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
              Address::operator=((Address *)this_00,&local_710);
              Address::~Address(&local_710);
              Address::ToString_abi_cxx11_(&local_790,(Address *)this_00);
              std::operator+(&local_770,"coaps://[",&local_790);
              std::operator+(&local_750,&local_770,"]");
              std::operator+(&local_730,&local_750,"/c/pg");
              std::__cxx11::string::operator=((string *)&request.mEndpoint,(string *)&local_730);
              std::__cxx11::string::~string((string *)&local_730);
              std::__cxx11::string::~string((string *)&local_750);
              std::__cxx11::string::~string((string *)&local_770);
              std::__cxx11::string::~string((string *)&local_790);
              aInteger = Timestamp::Encode(&aDataset->mPendingTimestamp);
              utils::Encode<unsigned_long>((ByteArray *)((long)&uri.field_2 + 8),aInteger);
              utils::Encode<unsigned_int>((ByteArray *)((long)&uri.field_2 + 8),aMaxRetrievalTimer);
              local_7a0._M_current =
                   (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       (uri.field_2._M_local_buf + 8));
              __gnu_cxx::
              __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::__normal_iterator<unsigned_char*>
                        ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)&local_798,&local_7a0);
              local_7a8._M_current = (char *)std::__cxx11::string::begin();
              local_7b0 = (char *)std::__cxx11::string::end();
              local_7b8 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                                   insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                                             ((vector<unsigned_char,std::allocator<unsigned_char>> *
                                              )(uri.field_2._M_local_buf + 8),local_798,local_7a8,
                                              (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               )local_7b0);
              tlv::Tlv::Tlv(&local_800,kSecureDissemination,(ByteArray *)((long)&uri.field_2 + 8),
                            kMeshCoP);
              AppendTlv(&local_7e0,(Message *)local_3d8,&local_800);
              pEVar4 = Error::operator=((Error *)&pbbrAddr.mBytes.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                        ,&local_7e0);
              local_804 = kNone;
              bVar1 = commissioner::operator!=(pEVar4,&local_804);
              Error::~Error(&local_7e0);
              tlv::Tlv::~Tlv(&local_800);
              if (!bVar1) {
                EncodePendingOperationalDataset(&local_830,(Request *)local_3d8,aDataset);
                pEVar4 = Error::operator=((Error *)&pbbrAddr.mBytes.
                                                                                                        
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          ,&local_830);
                local_834 = kNone;
                bVar1 = commissioner::operator!=(pEVar4,&local_834);
                Error::~Error(&local_830);
                if (!bVar1) {
                  uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
                  if ((uVar2 & 1) != 0) {
                    SignRequest(&local_860,this,(Request *)local_3d8,kMeshCoP,true);
                    pEVar4 = Error::operator=((Error *)&pbbrAddr.mBytes.
                                                                                                                
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              ,&local_860);
                    local_864 = kNone;
                    bVar1 = commissioner::operator!=(pEVar4,&local_864);
                    Error::~Error(&local_860);
                    if (bVar1) goto LAB_0024c2d3;
                  }
                  std::
                  function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
                  function<ot::commissioner::CommissionerImpl::SetSecurePendingDataset(std::function<void(ot::commissioner::Error)>,unsigned_int,ot::commissioner::PendingOperationalDataset_const&)::__4&,void>
                            ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>
                              *)&local_888,
                             (anon_class_32_1_d0c21527 *)
                             &onMeshLocalPrefixResponse.aDataset.mPendingTimestamp);
                  ProxyClient::SendRequest
                            (&this->mProxyClient,(Request *)local_3d8,&local_888,
                             (Address *)
                             &secureDissemination.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,0xf0bf);
                  std::
                  function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>
                  ::~function(&local_888);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_8a8,"mgmt",&local_8a9);
                  SetSecurePendingDataset::anon_class_1_0_00000001::operator()(&local_8e2);
                  local_148 = &local_8e0;
                  local_150 = &local_8e1;
                  bVar5 = ::fmt::v10::operator()(local_150);
                  local_8d8 = bVar5.size_;
                  local_8e0 = (v10 *)bVar5.data_;
                  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                  local_270 = &local_8d0;
                  local_280 = local_8e0;
                  sStack_278 = local_8d8;
                  local_e0 = &local_280;
                  local_290 = local_8e0;
                  local_288 = local_8d8;
                  local_d8 = local_290;
                  sStack_d0 = local_288;
                  this_local = (CommissionerImpl *)
                               ::fmt::v10::
                               make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                         ();
                  local_48 = local_2a0;
                  local_50 = &this_local;
                  local_38 = 0;
                  args_02.field_1.values_ = in_R9.values_;
                  args_02.desc_ = (unsigned_long_long)local_50;
                  fmt_02.size_ = 0;
                  fmt_02.data_ = (char *)local_288;
                  local_40 = local_50;
                  local_30 = local_48;
                  local_28 = local_50;
                  ::fmt::v10::vformat_abi_cxx11_(&local_8d0,local_290,fmt_02,args_02);
                  Log(kDebug,&local_8a8,&local_8d0);
                  std::__cxx11::string::~string((string *)&local_8d0);
                  std::__cxx11::string::~string((string *)&local_8a8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0024c2d3:
  local_8e8 = kNone;
  bVar1 = commissioner::operator!=
                    ((Error *)&pbbrAddr.mBytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,&local_8e8);
  if (bVar1) {
    Error::Error(&local_910,
                 (Error *)&pbbrAddr.mBytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
    std::function<void_(ot::commissioner::Error)>::operator()(aHandler,&local_910);
    Error::~Error(&local_910);
  }
  SetSecurePendingDataset(std::function<void(ot::commissioner::Error)>,unsigned_int,ot::commissioner::PendingOperationalDataset_const&)
  ::$_0::~__0((__0 *)local_518);
  SetSecurePendingDataset(std::function<void(ot::commissioner::Error)>,unsigned_int,ot::commissioner::PendingOperationalDataset_const&)
  ::$_4::~__4((__4 *)&onMeshLocalPrefixResponse.aDataset.mPendingTimestamp);
  coap::Message::~Message((Message *)local_3d8);
  std::__cxx11::string::~string((string *)&request.mEndpoint);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&uri.field_2 + 8));
  Address::~Address((Address *)
                    &secureDissemination.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  Error::~Error((Error *)&pbbrAddr.mBytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void CommissionerImpl::SetSecurePendingDataset(ErrorHandler                     aHandler,
                                               uint32_t                         aMaxRetrievalTimer,
                                               const PendingOperationalDataset &aDataset)
{
    Error         error;
    Address       pbbrAddr;
    ByteArray     secureDissemination;
    std::string   uri;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        aHandler(HandleStateResponse(aResponse, aError));
    };

    auto onMeshLocalPrefixResponse = [=](Error aError) {
        if (aError == ErrorCode::kNone)
        {
            SetSecurePendingDataset(aHandler, aMaxRetrievalTimer, aDataset);
        }
        else
        {
            aHandler(aError);
        }
    };

    // Delay timer is mandatory.
    VerifyOrExit(aDataset.mPresentFlags & PendingOperationalDataset::kDelayTimerBit,
                 error = ERROR_INVALID_ARGS("Delay Timer is mandatory for a Secure Pending Operational Dataset"));

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    VerifyOrExit(IsCcmMode(),
                 error = ERROR_INVALID_STATE("sending MGMT_SEC_PENDING_SET.req is only valid in CCM mode"));

    if (mProxyClient.GetMeshLocalPrefix().empty())
    {
        mProxyClient.FetchMeshLocalPrefix(onMeshLocalPrefixResponse);
        ExitNow();
    }

    SuccessOrExit(error = request.SetUriPath(uri::kMgmtSecPendingSet));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerSessionId, GetSessionId()}));

    pbbrAddr = mProxyClient.GetAnycastLocator(kPrimaryBbrAloc16);
    uri      = "coaps://[" + pbbrAddr.ToString() + "]" + uri::kMgmtPendingGet;

    utils::Encode(secureDissemination, aDataset.mPendingTimestamp.Encode());
    utils::Encode(secureDissemination, aMaxRetrievalTimer);
    secureDissemination.insert(secureDissemination.end(), uri.begin(), uri.end());
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kSecureDissemination, secureDissemination}));

    SuccessOrExit(error = EncodePendingOperationalDataset(request, aDataset));

    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }

    mProxyClient.SendRequest(request, onResponse, pbbrAddr, kDefaultMmPort);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MGMT_SEC_PENDING_SET.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(error);
    }
}